

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_effects.c
# Opt level: O2

void copysymboltypeinfo(MOJOSHADER_symbolTypeInfo *dst,MOJOSHADER_symbolTypeInfo *src,
                       MOJOSHADER_malloc m,void *d)

{
  MOJOSHADER_symbolClass MVar1;
  MOJOSHADER_symbolType MVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  MOJOSHADER_symbolStructMember *pMVar8;
  size_t sVar9;
  char *pcVar10;
  ulong uVar11;
  long lVar12;
  MOJOSHADER_symbolStructMember *pMVar13;
  
  MVar1 = src->parameter_class;
  MVar2 = src->parameter_type;
  uVar3 = src->rows;
  uVar4 = src->columns;
  uVar5 = src->member_count;
  uVar6 = *(undefined4 *)&src->members;
  uVar7 = *(undefined4 *)((long)&src->members + 4);
  dst->elements = src->elements;
  dst->member_count = uVar5;
  *(undefined4 *)&dst->members = uVar6;
  *(undefined4 *)((long)&dst->members + 4) = uVar7;
  dst->parameter_class = MVar1;
  dst->parameter_type = MVar2;
  dst->rows = uVar3;
  dst->columns = uVar4;
  if (dst->member_count != 0) {
    pMVar8 = (MOJOSHADER_symbolStructMember *)(*m)(dst->member_count * 0x28,d);
    dst->members = pMVar8;
    lVar12 = 8;
    for (uVar11 = 0; uVar11 < dst->member_count; uVar11 = uVar11 + 1) {
      pMVar8 = src->members;
      pcVar10 = *(char **)((long)pMVar8 + lVar12 + -8);
      if (pcVar10 == (char *)0x0) {
        pMVar13 = dst->members;
      }
      else {
        sVar9 = strlen(pcVar10);
        pcVar10 = (char *)(*m)((int)sVar9 + 1,d);
        strcpy(pcVar10,*(char **)((long)src->members + lVar12 + -8));
        pMVar13 = dst->members;
        *(char **)((long)pMVar13 + lVar12 + -8) = pcVar10;
        pMVar8 = src->members;
      }
      copysymboltypeinfo((MOJOSHADER_symbolTypeInfo *)((long)&pMVar13->name + lVar12),
                         (MOJOSHADER_symbolTypeInfo *)((long)&pMVar8->name + lVar12),m,d);
      lVar12 = lVar12 + 0x28;
    }
  }
  return;
}

Assistant:

void copysymboltypeinfo(MOJOSHADER_symbolTypeInfo *dst,
                        MOJOSHADER_symbolTypeInfo *src,
                        MOJOSHADER_malloc m,
                        void *d)
{
    int i;
    uint32 siz = 0;
    char *stringcopy = NULL;
    memcpy(dst, src, sizeof (MOJOSHADER_symbolTypeInfo));
    if (dst->member_count > 0)
    {
        siz = dst->member_count * sizeof (MOJOSHADER_symbolStructMember);
        dst->members = (MOJOSHADER_symbolStructMember *) m(siz, d);
        for (i = 0; i < dst->member_count; i++)
        {
            COPY_STRING(members[i].name)
            copysymboltypeinfo(&dst->members[i].info, &src->members[i].info, m, d);
        } // for
    } // if
}